

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int properties_set_content_type(PROPERTIES_HANDLE properties,char *content_type_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  PROPERTIES_INSTANCE *properties_instance;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x40c4;
  }
  else {
    item_value = amqpvalue_create_symbol(content_type_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x40cc;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,6,item_value);
      iVar2 = 0x40d2;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int properties_set_content_type(PROPERTIES_HANDLE properties, const char* content_type_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE content_type_amqp_value = amqpvalue_create_symbol(content_type_value);
        if (content_type_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 6, content_type_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(content_type_amqp_value);
        }
    }

    return result;
}